

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

int __thiscall
QUnsortedModelEngine::buildIndices
          (QUnsortedModelEngine *this,QString *str,QModelIndex *parent,int n,QIndexMapper *indices,
          QMatchData *m)

{
  bool bVar1;
  Int IVar2;
  QCompleterPrivate *pQVar3;
  int *piVar4;
  char cVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  int iVar9;
  CaseSensitivity CVar10;
  parameter_type t;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  lVar12 = 0;
  iVar9 = 0;
  while( true ) {
    bVar1 = indices->v;
    if (bVar1 == true) {
      iVar6 = (int)(indices->vector).d.size;
    }
    else {
      iVar6 = (indices->t - indices->f) + 1;
    }
    iVar11 = (int)lVar12;
    if ((iVar6 <= lVar12) || (iVar9 == n)) break;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    if (bVar1 == false) {
      iVar6 = indices->f + iVar11;
    }
    else {
      iVar6 = (indices->vector).d.ptr[lVar12];
    }
    (**(code **)(*plVar7 + 0x60))
              (&local_78,plVar7,iVar6,((this->super_QCompletionEngine).c)->column,parent);
    uVar8 = (**(code **)(*plVar7 + 0x138))(plVar7,&local_78);
    if ((uVar8 & 1) != 0) {
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d._0_4_ = 0xaaaaaaaa;
      local_98.d._4_4_ = 0xaaaaaaaa;
      local_98.ptr._0_4_ = 0xaaaaaaaa;
      local_98.ptr._4_4_ = 0xaaaaaaaa;
      (**(code **)(*plVar7 + 0x90))
                (&local_58,plVar7,&local_78,((this->super_QCompletionEngine).c)->role);
      ::QVariant::toString();
      ::QVariant::~QVariant(&local_58);
      pQVar3 = (this->super_QCompletionEngine).c;
      IVar2 = (pQVar3->filterMode).super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
              super_QFlagsStorage<Qt::MatchFlag>.i;
      CVar10 = (CaseSensitivity)str;
      if (IVar2 == 1) {
        cVar5 = QString::contains((QString *)&local_98,str,pQVar3->cs);
joined_r0x005d28d9:
        if (cVar5 != '\0') goto LAB_005d28db;
      }
      else {
        if (IVar2 == 3) {
          cVar5 = QString::endsWith((QString *)&local_98,CVar10);
          goto joined_r0x005d28d9;
        }
        if (IVar2 == 2) {
          cVar5 = QString::startsWith((QString *)&local_98,CVar10);
          goto joined_r0x005d28d9;
        }
LAB_005d28db:
        if (indices->v == true) {
          t = (indices->vector).d.ptr[lVar12];
        }
        else {
          t = indices->f + iVar11;
        }
        QList<int>::append(&(m->indices).vector,t);
        iVar9 = iVar9 + 1;
        if ((m->exactMatchIndex == -1) &&
           (iVar6 = QString::compare((QString *)&local_98,CVar10), iVar6 == 0)) {
          if (indices->v == true) {
            piVar4 = (indices->vector).d.ptr;
            m->exactMatchIndex = piVar4[lVar12];
            if (n == -1) {
              iVar6 = piVar4[lVar12];
LAB_005d29ba:
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
LAB_005d2989:
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
                __stack_chk_fail();
              }
              return iVar6;
            }
          }
          else {
            iVar6 = indices->f;
            m->exactMatchIndex = iVar11 + iVar6;
            if (n == -1) {
              iVar6 = iVar6 + iVar11;
              goto LAB_005d29ba;
            }
          }
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    lVar12 = lVar12 + 1;
  }
  if (bVar1 == false) {
    iVar6 = indices->f + iVar11 + -1;
  }
  else {
    iVar6 = (indices->vector).d.ptr[lVar12 + -1];
  }
  goto LAB_005d2989;
}

Assistant:

int QUnsortedModelEngine::buildIndices(const QString& str, const QModelIndex& parent, int n,
                                      const QIndexMapper& indices, QMatchData* m)
{
    Q_ASSERT(m->partial);
    Q_ASSERT(n != -1 || m->exactMatchIndex == -1);
    const QAbstractItemModel *model = c->proxy->sourceModel();
    int i, count = 0;

    for (i = 0; i < indices.count() && count != n; ++i) {
        QModelIndex idx = model->index(indices[i], c->column, parent);

        if (!(model->flags(idx) & Qt::ItemIsSelectable))
            continue;

        QString data = model->data(idx, c->role).toString();

        switch (c->filterMode) {
        case Qt::MatchStartsWith:
            if (!data.startsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchContains:
            if (!data.contains(str, c->cs))
                continue;
            break;
        case Qt::MatchEndsWith:
            if (!data.endsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchExactly:
        case Qt::MatchFixedString:
        case Qt::MatchCaseSensitive:
        case Qt::MatchRegularExpression:
        case Qt::MatchWildcard:
        case Qt::MatchWrap:
        case Qt::MatchRecursive:
            Q_UNREACHABLE();
            break;
        }
        m->indices.append(indices[i]);
        ++count;
        if (m->exactMatchIndex == -1 && QString::compare(data, str, c->cs) == 0) {
            m->exactMatchIndex = indices[i];
            if (n == -1)
                return indices[i];
        }
    }
    return indices[i-1];
}